

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Vertex2DTextureCase::iterate(Vertex2DTextureCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int y;
  int w_;
  int h_;
  RenderTarget *pRVar6;
  char *pcVar7;
  long lVar8;
  RenderContext *pRVar9;
  TestLog *log;
  deUint32 local_290;
  undefined1 local_240 [7];
  bool isOk;
  undefined1 local_218 [8];
  Surface resImage;
  TexSizeIVec local_1f0;
  undefined1 local_1e8 [16];
  Grid grid;
  bool useSafeTexCoords;
  Vec2 local_184;
  float local_17c;
  Rect *pRStack_178;
  float lod;
  Render *rend;
  int renderNdx;
  Rect local_158;
  Rect local_148;
  Rect local_138;
  undefined1 local_128 [8];
  Render renders [4];
  undefined1 local_90 [8];
  Surface refImage;
  Vec2 texMagOffset;
  Vec2 texMagScale;
  Vec2 texMinOffset;
  Vec2 texMinScale;
  int topHeight;
  int bottomHeight;
  int rightWidth;
  int leftWidth;
  int viewportYOffset;
  undefined1 local_30 [4];
  int viewportXOffset;
  Random rnd;
  int viewportYOffsetMax;
  int viewportXOffsetMax;
  int viewportHeight;
  int viewportWidth;
  Vertex2DTextureCase *this_local;
  
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar6);
  iVar2 = ::deMin32(iVar2,0x100);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getHeight(pRVar6);
  iVar3 = ::deMin32(iVar3,0x100);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar6);
  rnd.m_rnd.w = iVar4 - iVar2;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar6);
  rnd.m_rnd.z = iVar4 - iVar3;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar7);
  de::Random::Random((Random *)local_30,dVar5);
  iVar4 = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.w);
  y = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.z);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(dVar5);
  w_ = iVar2 / 2;
  h_ = iVar3 / 2;
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  tcu::Vector<float,_2>::Vector(&texMinOffset,1.8,1.8);
  tcu::Vector<float,_2>::Vector(&texMagScale,-0.3,-0.2);
  tcu::Vector<float,_2>::Vector(&texMagOffset,0.3,0.3);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&refImage.m_pixels.m_cap,0.9,0.8);
  tcu::Surface::Surface((Surface *)local_90,iVar2,iVar3);
  anon_unknown_1::Rect::Rect(&local_138,0,0,w_,h_);
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (local_128,&local_138,0,&texMinOffset,&texMagScale);
  anon_unknown_1::Rect::Rect(&local_148,w_,0,iVar2 - w_,h_);
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (&renders[0].texCoordOffset,&local_148,0,&texMagOffset,(Vec2 *)&refImage.m_pixels.m_cap)
  ;
  anon_unknown_1::Rect::Rect(&local_158,0,h_,w_,iVar3 - h_);
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (&renders[1].texCoordOffset,&local_158,1,&texMinOffset,&texMagScale);
  anon_unknown_1::Rect::Rect((Rect *)&stack0xfffffffffffffe98,w_,h_,iVar2 - w_,iVar3 - h_);
  iterate()::Render::Render(deqp::gles2::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
  Vector<float,2>const&,tcu::Vector<float,2>_const__
            (&renders[2].texCoordOffset,(Rect *)&stack0xfffffffffffffe98,1,&texMagOffset,
             (Vec2 *)&refImage.m_pixels.m_cap);
  for (rend._4_4_ = 0; rend._4_4_ < 4; rend._4_4_ = rend._4_4_ + 1) {
    lVar8 = (long)rend._4_4_;
    pRStack_178 = (Rect *)&renders[lVar8 + -1].texCoordOffset;
    anon_unknown_1::Rect::size
              ((Rect *)((long)&grid.m_indices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_184);
    local_17c = calculateLod(this,(Vec2 *)&renders[lVar8].region.h,&local_184,pRStack_178[1].x);
    if (local_17c <= 0.0) {
      local_290 = this->m_magFilter;
    }
    else {
      local_290 = this->m_minFilter;
    }
    grid.m_indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = isLevelNearest(local_290);
    anon_unknown_1::Rect::size((Rect *)local_1e8);
    getTextureSize((Functional *)&local_1f0,this->m_textures[pRStack_178[1].x]);
    anon_unknown_1::TexTypeCoordParams<(glu::TextureTestUtil::TextureType)0>::TexTypeCoordParams
              ((TexTypeCoordParams<(glu::TextureTestUtil::TextureType)0> *)&resImage.m_pixels.m_cap,
               (Vec2 *)&pRStack_178[1].y,(Vec2 *)&pRStack_178[1].h);
    anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0>::PosTexCoordQuadGrid
              ((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0> *)(local_1e8 + 8),0x7f,
               (IVec2 *)local_1e8,&local_1f0,(TexCoordParams *)&resImage.m_pixels.m_cap,
               (bool)(grid.m_indices.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
    glwViewport(iVar4 + pRStack_178->x,y + pRStack_178->y,pRStack_178->w,pRStack_178->h);
    renderCell(this,pRStack_178[1].x,local_17c,(Grid *)(local_1e8 + 8));
    computeReferenceCell
              (this,pRStack_178[1].x,local_17c,(Grid *)(local_1e8 + 8),(Surface *)local_90,
               pRStack_178);
    anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0>::~PosTexCoordQuadGrid
              ((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0> *)(local_1e8 + 8));
  }
  tcu::Surface::Surface((Surface *)local_218,iVar2,iVar3);
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_240,(Surface *)local_218);
  glu::readPixels(pRVar9,iVar4,y,(PixelBufferAccess *)local_240);
  glwUseProgram(0);
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = compareImages(pRVar9,log,(Surface *)local_90,(Surface *)local_218);
  pcVar7 = "Image comparison failed";
  if (bVar1) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar1 & QP_TEST_RESULT_FAIL,pcVar7);
  tcu::Surface::~Surface((Surface *)local_218);
  tcu::Surface::~Surface((Surface *)local_90);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

Vertex2DTextureCase::IterateResult Vertex2DTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_2D_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_2D_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 cells.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(+1.8f, +1.8f);
	const Vec2 texMinOffset		(-0.3f, -0.2f);
	const Vec2 texMagScale		(+0.3f, +0.3f);
	const Vec2 texMagOffset		(+0.9f, +0.8f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	{
		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(0,				0,				leftWidth,	bottomHeight),	0, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		0,				rightWidth,	bottomHeight),	0, texMagScale, texMagOffset),
			Render(Rect(0,				bottomHeight,	leftWidth,	topHeight),		1, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		bottomHeight,	rightWidth,	topHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_2D, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_2D>(rend.texCoordScale, rend.texCoordOffset), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}